

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.hpp
# Opt level: O2

void __thiscall
zmq::encoder_base_t<zmq::v2_encoder_t>::encoder_base_t
          (encoder_base_t<zmq::v2_encoder_t> *this,size_t bufsize_)

{
  uchar *puVar1;
  
  (this->super_i_encoder)._vptr_i_encoder = (_func_int **)&PTR__encoder_base_t_0024b8d8;
  this->_write_pos = (uchar *)0x0;
  this->_to_write = 0;
  this->_next = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  this->_new_msg_flag = false;
  this->_buf_size = bufsize_;
  puVar1 = (uchar *)malloc(bufsize_);
  this->_buf = puVar1;
  this->_in_progress = (msg_t *)0x0;
  if (puVar1 != (uchar *)0x0) {
    return;
  }
  fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/encoder.hpp"
          ,0x42);
  fflush(_stderr);
  zmq_abort("FATAL ERROR: OUT OF MEMORY");
  return;
}

Assistant:

explicit encoder_base_t (size_t bufsize_) :
        _write_pos (0),
        _to_write (0),
        _next (NULL),
        _new_msg_flag (false),
        _buf_size (bufsize_),
        _buf (static_cast<unsigned char *> (malloc (bufsize_))),
        _in_progress (NULL)
    {
        alloc_assert (_buf);
    }